

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall
restincurl::RequestBuilder::Header(RequestBuilder *this,string *name,string *value)

{
  char *value_00;
  RequestBuilder *pRVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  string *value_local;
  string *name_local;
  RequestBuilder *this_local;
  
  std::operator+(local_60,(char *)name);
  std::operator+(local_40,local_60);
  std::__cxx11::string::~string((string *)local_60);
  value_00 = (char *)std::__cxx11::string::c_str();
  pRVar1 = Header(this,value_00);
  std::__cxx11::string::~string((string *)local_40);
  return pRVar1;
}

Assistant:

RequestBuilder& Header(const std::string& name,
                               const std::string& value) {
            const auto v = name + ": " + value;
            return Header(v.c_str());
        }